

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::setVelocity(MidiMessage *this,int value)

{
  bool bVar1;
  
  bVar1 = isNote(this);
  if (bVar1) {
    setP2(this,value & 0x7f);
    return;
  }
  return;
}

Assistant:

void MidiMessage::setVelocity(int value) {
	if (isNote()) {
		setP2(value & 0x7f);
	} else {
		// don't do anything since this is not a note-related message.
	}
}